

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O1

Move MCTS::compute_move<NimState>(TestGame root_state,ComputeOptions options)

{
  Node<NimState> *pNVar1;
  mapped_type *pmVar2;
  mapped_type_conflict *pmVar3;
  double dVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Rb_tree_color _Var7;
  int iVar8;
  long lVar9;
  pointer ppNVar10;
  int in_EDI;
  long lVar11;
  int in_stack_00000008;
  Move best_move;
  byte in_stack_00000018;
  uint7 in_stack_00000019;
  int move;
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  roots;
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  root_futures;
  vector<int,_std::allocator<int>_> moves;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> wins;
  ComputeOptions job_options;
  _Rb_tree_color local_12c;
  double local_128;
  double local_120;
  double local_118;
  _Rb_tree_color local_10c;
  double local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [8];
  _Rb_tree_node_base local_f0;
  size_t local_d0;
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  local_c8;
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  local_a8;
  vector<int,_std::allocator<int>_> local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_78;
  long local_38;
  
  if (1 < in_EDI - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x17c);
  }
  NimState::get_moves(&local_90,(NimState *)local_100);
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if ((long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start == 4) {
      _Var7 = *local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      local_a8.
      super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38 = (ulong)in_stack_00000019 << 8;
      lVar11 = (long)in_stack_00000008;
      if (0 < lVar11) {
        iVar8 = 0;
        do {
          local_f0._0_8_ = local_100;
          local_f8._0_4_ = iVar8;
          local_f0._M_parent = (_Base_ptr)&stack0xffffffffffffffb8;
          std::async<MCTS::compute_move<NimState>(NimState,MCTS::ComputeOptions)::_lambda()_1_&>
                    ((launch)&local_78,(anon_class_24_3_cbaa58e5_for__M_head_impl *)0x1);
          std::
          vector<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>,std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>>
          ::
          emplace_back<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
                    ((vector<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>,std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>>
                      *)&local_a8,
                     (future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
                      *)&local_78);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_78._M_impl.super__Rb_tree_header._M_header._4_4_,
                       local_78._M_impl.super__Rb_tree_header._M_header._M_color) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_78._M_impl.super__Rb_tree_header._M_header._4_4_,
                                local_78._M_impl.super__Rb_tree_header._M_header._M_color));
          }
          iVar8 = iVar8 + 1;
        } while (in_stack_00000008 != iVar8);
      }
      local_c8.
      super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < in_stack_00000008) {
        lVar9 = 0;
        do {
          std::
          future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
          ::get((future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
                 *)local_f8);
          std::
          vector<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>,std::allocator<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
          ::
          emplace_back<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>
                    ((vector<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>,std::allocator<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
                      *)&local_c8,
                     (unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
                      *)local_f8);
          pNVar1 = (Node<NimState> *)CONCAT44(local_f8._4_4_,local_f8._0_4_);
          if (pNVar1 != (Node<NimState> *)0x0) {
            Node<NimState>::~Node(pNVar1);
            operator_delete(pNVar1);
          }
          lVar9 = lVar9 + 0x10;
        } while (lVar11 << 4 != lVar9);
      }
      local_f0._M_left = &local_f0;
      local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
      local_f0._M_parent = (_Base_ptr)0x0;
      local_d0 = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f0._M_right = local_f0._M_left;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      if (in_stack_00000008 < 1) {
        local_118 = 0.0;
      }
      else {
        lVar9 = 0;
        dVar4 = 0.0;
        local_118 = (double)lVar11;
        do {
          pNVar1 = local_c8.
                   super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
                   super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>
                   .super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl;
          local_108 = (double)(long)pNVar1->visits;
          local_120 = dVar4;
          for (ppNVar10 = *(pointer *)
                           &(pNVar1->children).
                            super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>
                            ._M_impl;
              ppNVar10 !=
              *(pointer *)
               ((long)&(pNVar1->children).
                       super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>
               + 8); ppNVar10 = ppNVar10 + 1) {
            iVar8 = (*ppNVar10)->visits;
            pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_f8,&(*ppNVar10)->move);
            *pmVar2 = *pmVar2 + iVar8;
            local_128 = (*ppNVar10)->wins;
            pmVar3 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)&local_78,&(*ppNVar10)->move);
            *pmVar3 = local_128 + *pmVar3;
          }
          dVar4 = (double)((long)local_120 + (long)local_108);
          lVar9 = lVar9 + 1;
        } while ((double)lVar9 != local_118);
        local_118 = (double)(long)dVar4;
      }
      local_12c = _S_red;
      if (local_f0._M_left != &local_f0) {
        local_120 = -1.0;
        p_Var6 = local_f0._M_left;
        do {
          _Var7 = p_Var6[1]._M_color;
          local_128 = (double)*(int *)&p_Var6[1].field_0x4;
          local_10c = _Var7;
          pmVar3 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_78,(key_type *)&local_10c);
          local_108 = *pmVar3;
          dVar4 = (local_108 + 1.0) / (local_128 + 2.0);
          if (local_120 < dVar4) {
            local_12c = local_10c;
            local_120 = dVar4;
          }
          if ((in_stack_00000018 & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Move: ",6);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,_Var7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
            lVar11 = *(long *)poVar5;
            *(undefined8 *)(poVar5 + *(long *)(lVar11 + -0x18) + 0x10) = 2;
            lVar11 = *(long *)(lVar11 + -0x18);
            *(uint *)(poVar5 + lVar11 + 0x18) =
                 *(uint *)(poVar5 + lVar11 + 0x18) & 0xffffff4f | 0x80;
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar5,(int)((local_128 * 100.0) / local_118 + 0.5));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% visits)",9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
            lVar11 = *(long *)poVar5;
            *(undefined8 *)(poVar5 + *(long *)(lVar11 + -0x18) + 0x10) = 2;
            lVar11 = *(long *)(lVar11 + -0x18);
            *(uint *)(poVar5 + lVar11 + 0x18) =
                 *(uint *)(poVar5 + lVar11 + 0x18) & 0xffffff4f | 0x80;
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar5,(int)((local_108 * 100.0) / local_128 + 0.5));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% wins)",7);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != &local_f0);
      }
      if (in_stack_00000018 != 0) {
        pmVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_78,(key_type *)&local_12c);
        local_128 = *pmVar3;
        pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_f8,(key_type *)&local_12c);
        iVar8 = *pmVar2;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"----",4);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Best: ",6);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,local_12c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
        local_120 = (double)iVar8;
        poVar5 = std::ostream::_M_insert<double>((local_120 * 100.0) / local_118);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% visits)",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
        poVar5 = std::ostream::_M_insert<double>((local_128 * 100.0) / local_120);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% wins)",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      _Var7 = local_12c;
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_78);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_f8);
      std::
      vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ::~vector(&local_c8);
      std::
      vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ::~vector(&local_a8);
    }
    if ((_Rb_tree_color *)
        local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (_Rb_tree_color *)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return _Var7;
  }
  assertion_failed("moves.size() > 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                   ,0x17f);
}

Assistant:

typename State::Move compute_move(const State root_state,
                                  const ComputeOptions options)
{
	using namespace std;

	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);

	auto moves = root_state.get_moves();
	attest(moves.size() > 0);
	if (moves.size() == 1) {
		return moves[0];
	}

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	#endif

	// Start all jobs to compute trees.
	vector<future<unique_ptr<Node<State>>>> root_futures;
	ComputeOptions job_options = options;
	job_options.verbose = false;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto func = [t, &root_state, &job_options] () -> std::unique_ptr<Node<State>>
		{
			return compute_tree(root_state, job_options, 1012411 * t + 12515);
		};

		root_futures.push_back(std::async(std::launch::async, func));
	}

	// Collect the results.
	vector<unique_ptr<Node<State>>> roots;
	for (int t = 0; t < options.number_of_threads; ++t) {
		roots.push_back(std::move(root_futures[t].get()));
	}

	// Merge the children of all root nodes.
	map<typename State::Move, int> visits;
	map<typename State::Move, double> wins;
	long long games_played = 0;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto root = roots[t].get();
		games_played += root->visits;
		for (auto child = root->children.cbegin(); child != root->children.cend(); ++child) {
			visits[(*child)->move] += (*child)->visits;
			wins[(*child)->move]   += (*child)->wins;
		}
	}

	// Find the node with the highest score.
	double best_score = -1;
	typename State::Move best_move = typename State::Move();
	for (auto itr: visits) {
		auto move = itr.first;
		double v = itr.second;
		double w = wins[move];
		// Expected success rate assuming a uniform prior (Beta(1, 1)).
		// https://en.wikipedia.org/wiki/Beta_distribution
		double expected_success_rate = (w + 1) / (v + 2);
		if (expected_success_rate > best_score) {
			best_move = move;
			best_score = expected_success_rate;
		}

		if (options.verbose) {
			cerr << "Move: " << itr.first
			     << " (" << setw(2) << right << int(100.0 * v / double(games_played) + 0.5) << "% visits)"
			     << " (" << setw(2) << right << int(100.0 * w / v + 0.5)    << "% wins)" << endl;
		}
	}

	if (options.verbose) {
		auto best_wins = wins[best_move];
		auto best_visits = visits[best_move];
		cerr << "----" << endl;
		cerr << "Best: " << best_move
		     << " (" << 100.0 * best_visits / double(games_played) << "% visits)"
		     << " (" << 100.0 * best_wins / best_visits << "% wins)" << endl;
	}

	#ifdef USE_OPENMP
	if (options.verbose) {
		double time = ::omp_get_wtime();
		std::cerr << games_played << " games played in " << double(time - start_time) << " s. "
		          << "(" << double(games_played) / (time - start_time) << " / second, "
		          << options.number_of_threads << " parallel jobs)." << endl;
	}
	#endif

	return best_move;
}